

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

int AString_compareCString(AString *str,char *cstr)

{
  char *cstr_local;
  AString *str_local;
  
  if ((str == (AString *)0x0) && (cstr == (char *)0x0)) {
    str_local._4_4_ = 0;
  }
  else if (str == (AString *)0x0) {
    str_local._4_4_ = -1;
  }
  else if (cstr == (char *)0x0) {
    str_local._4_4_ = 1;
  }
  else {
    str_local._4_4_ = strcmp(str->buffer,cstr);
  }
  return str_local._4_4_;
}

Assistant:

ACUTILS_HD_FUNC int AString_compareCString(const struct AString *str, const char *cstr)
{
    if(str == nullptr && cstr == nullptr)
        return 0;
    else if(str == nullptr)
        return -1;
    else if(cstr == nullptr)
        return 1;
    return strcmp(str->buffer, cstr);
}